

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void imguiMaterial(cgltf_material *material)

{
  bool bVar1;
  char *pcVar2;
  Span local_78 [16];
  Span<char> local_68;
  size_t local_58;
  size_t texInd_1;
  Span<char> local_40;
  size_t local_30;
  size_t texInd;
  cgltf_float (*colorFactor) [4];
  cgltf_pbr_metallic_roughness *props;
  size_t i;
  cgltf_material *material_local;
  
  i = (size_t)material;
  props = (cgltf_pbr_metallic_roughness *)getMaterialInd(material);
  ImGui::Text("Name: %s",*(undefined8 *)i);
  if ((*(int *)(i + 8) != 0) && (bVar1 = ImGui::TreeNode("PBR Metallic-Roughness"), bVar1)) {
    colorFactor = (cgltf_float (*) [4])(i + 0x10);
    texInd = i + 0x90;
    ImGui::Text("Base color factor: {%g, %g, %g, %g}",(double)*(float *)texInd,
                (double)*(float *)(i + 0x94),(double)*(float *)(i + 0x98),
                (double)*(float *)(i + 0x9c));
    ImGui::Text("Metallic factor: %g",(double)colorFactor[9][0]);
    ImGui::Text("Roughness factor: %g",(double)colorFactor[9][1]);
    if (*(long *)*colorFactor != 0) {
      local_30 = getTextureInd(*(cgltf_texture **)*colorFactor);
      scratchStr();
      tl::toStringBuffer<char[16],unsigned_long,char[4],int,char[2],int>
                (&local_40,(char (*) [16])"Color texture: ",(unsigned_long *)&props,
                 (char (*) [4])" - ",(int *)(gpu::textureSizes + local_30 * 8),
                 (char (*) [2])0x38e7f3,(int *)(gpu::textureSizes + local_30 * 8 + 4));
      scratchStr();
      pcVar2 = tl::Span::operator_cast_to_char_((Span *)&texInd_1);
      bVar1 = ImGui::TreeNode(pcVar2);
      if (bVar1) {
        imguiTextureView((cgltf_texture_view *)colorFactor,
                         (float *)(imgui_state::materialTexturesHeights + (long)props * 8));
        ImGui::TreePop();
      }
    }
    if (*(long *)colorFactor[4] != 0) {
      local_58 = getTextureInd(*(cgltf_texture **)colorFactor[4]);
      scratchStr();
      tl::toStringBuffer<char[29],unsigned_long,char[4],int,char[2],int>
                (&local_68,(char (*) [29])"Metallic-roughness texture: ",(unsigned_long *)&props,
                 (char (*) [4])" - ",(int *)(gpu::textureSizes + local_58 * 8),
                 (char (*) [2])0x38e7f3,(int *)(gpu::textureSizes + local_58 * 8 + 4));
      scratchStr();
      pcVar2 = tl::Span::operator_cast_to_char_(local_78);
      bVar1 = ImGui::TreeNode(pcVar2);
      if (bVar1) {
        imguiTextureView((cgltf_texture_view *)(colorFactor + 4),
                         (float *)(imgui_state::materialTexturesHeights + (long)props * 8 + 4));
        ImGui::TreePop();
      }
    }
    ImGui::TreePop();
  }
  return;
}

Assistant:

static void imguiMaterial(const cgltf_material& material)
{
    const size_t i = getMaterialInd(&material);
    ImGui::Text("Name: %s", material.name);
    if(material.has_pbr_metallic_roughness)
    if(ImGui::TreeNode("PBR Metallic-Roughness"))
    {
        const auto& props = material.pbr_metallic_roughness;
        const auto& colorFactor = props.base_color_factor;
        ImGui::Text("Base color factor: {%g, %g, %g, %g}", colorFactor[0], colorFactor[1], colorFactor[2], colorFactor[3]);
        ImGui::Text("Metallic factor: %g", props.metallic_factor);
        ImGui::Text("Roughness factor: %g", props.roughness_factor);
        if(props.base_color_texture.texture)
        {
            const size_t texInd = getTextureInd(props.base_color_texture.texture);
            tl::toStringBuffer(scratchStr(), "Color texture: ", i, " - ", gpu::textureSizes[texInd].x, "x", gpu::textureSizes[texInd].y);
            if(ImGui::TreeNode(scratchStr())) {
                imguiTextureView(props.base_color_texture, &imgui_state::materialTexturesHeights[i].color);
                ImGui::TreePop();
            }
        }
        if(props.metallic_roughness_texture.texture)
        {
            const size_t texInd = getTextureInd(props.metallic_roughness_texture.texture);
            tl::toStringBuffer(scratchStr(), "Metallic-roughness texture: ", i, " - ", gpu::textureSizes[texInd].x, "x", gpu::textureSizes[texInd].y);
            if(ImGui::TreeNode(scratchStr())) {
                imguiTextureView(props.metallic_roughness_texture, &imgui_state::materialTexturesHeights[i].metallicRoughness);
                ImGui::TreePop();
            }
        }
        ImGui::TreePop();
    }
}